

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O3

string * __thiscall
t_js_generator::ts_function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_js_generator *this,t_function *tfunction,
          bool include_callback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  t_struct *ptVar2;
  pointer pcVar3;
  t_field *field;
  undefined1 *puVar4;
  string *psVar5;
  int iVar6;
  undefined8 *puVar7;
  long *plVar8;
  t_type *ptVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  size_type *psVar10;
  ulong *puVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  undefined8 uVar14;
  pointer pptVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  t_js_generator *local_b8;
  t_function *local_b0;
  string local_a8;
  undefined4 local_84;
  string *local_80;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_84 = (undefined4)CONCAT71(in_register_00000009,include_callback);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ptVar2 = tfunction->arglist_;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  pcVar3 = (tfunction->name_)._M_dataplus._M_p;
  local_b8 = this;
  local_b0 = tfunction;
  local_80 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_f8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  pptVar15 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar15 !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      field = *pptVar15;
      ts_get_req_abi_cxx11_(&local_a8,local_b8,field);
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_a8,0,(char *)0x0,(ulong)(field->name_)._M_dataplus._M_p);
      __return_storage_ptr__ = local_80;
      psVar10 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_d8.field_2._M_allocated_capacity = *psVar10;
        local_d8.field_2._8_8_ = puVar7[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar10;
        local_d8._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_d8._M_string_length = puVar7[1];
      *puVar7 = psVar10;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
      puVar11 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar11) {
        local_108 = *puVar11;
        lStack_100 = plVar8[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *puVar11;
        local_118 = (ulong *)*plVar8;
      }
      local_110 = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ts_get_type_abi_cxx11_(&local_78,local_b8,(*pptVar15)->type_);
      uVar12 = 0xf;
      if (local_118 != &local_108) {
        uVar12 = local_108;
      }
      if (uVar12 < local_78._M_string_length + local_110) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          uVar14 = local_78.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_78._M_string_length + local_110) goto LAB_0029eb8b;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_118);
      }
      else {
LAB_0029eb8b:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_118,(ulong)local_78._M_dataplus._M_p);
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      puVar11 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_f8.field_2._M_allocated_capacity = *puVar11;
        local_f8.field_2._8_8_ = puVar7[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *puVar11;
        local_f8._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_f8._M_string_length = puVar7[1];
      *puVar7 = puVar11;
      puVar7[1] = 0;
      *(undefined1 *)puVar11 = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      pptVar15 = pptVar15 + 1;
      if (pptVar15 ==
          (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if ((char)local_84 == '\0') goto LAB_0029eeea;
        if (pptVar15 ==
            (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start) goto LAB_0029ecb0;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    } while (pptVar15 !=
             (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((char)local_84 == '\0') {
LAB_0029eeea:
    if (local_b8->gen_es6_ == true) {
      ts_get_type_abi_cxx11_(&local_d8,local_b8,local_b0->returntype_);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x39b140);
      local_118 = &local_108;
      puVar11 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar11) {
        local_108 = *puVar11;
        lStack_100 = plVar8[3];
      }
      else {
        local_108 = *puVar11;
        local_118 = (ulong *)*plVar8;
      }
      local_110 = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_f8.field_2._M_allocated_capacity = *psVar10;
        local_f8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar10;
        local_f8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_f8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p);
      goto LAB_0029f349;
    }
    ts_get_type_abi_cxx11_(&local_d8,local_b8,local_b0->returntype_);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x39b106);
    local_118 = &local_108;
    puVar11 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar11) {
      local_108 = *puVar11;
      lStack_100 = puVar7[3];
    }
    else {
      local_108 = *puVar11;
      local_118 = (ulong *)*puVar7;
    }
    local_110 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_f8._M_string_length = puVar7[1];
    *puVar7 = psVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_0029f358;
  }
  else {
LAB_0029ecb0:
    if (local_b8->gen_node_ == true) {
      ptVar2 = local_b0->xceptions_;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_allocated_capacity =
           local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if ((ptVar2 != (t_struct *)0x0) &&
         (pptVar15 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
         pptVar15 !=
         (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        paVar1 = &local_d8.field_2;
        do {
          ptVar9 = t_type::get_true_type((*pptVar15)->type_);
          if (pptVar15 ==
              (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            js_type_namespace_abi_cxx11_(&local_d8,local_b8,ptVar9->program_);
            iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])(ptVar9);
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_d8,*(ulong *)CONCAT44(extraout_var,iVar6));
            puVar11 = puVar7 + 2;
            if ((ulong *)*puVar7 == puVar11) {
              local_108 = *puVar11;
              lStack_100 = puVar7[3];
              local_118 = &local_108;
            }
            else {
              local_108 = *puVar11;
              local_118 = (ulong *)*puVar7;
            }
            local_110 = puVar7[1];
            *puVar7 = puVar11;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_118);
            if (local_118 != &local_108) {
              operator_delete(local_118);
            }
            _Var13._M_p = local_d8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != paVar1) goto LAB_0029ee88;
          }
          else {
            js_type_namespace_abi_cxx11_(&local_a8,local_b8,ptVar9->program_);
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x39f1a2);
            psVar10 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_d8.field_2._M_allocated_capacity = *psVar10;
              local_d8.field_2._8_8_ = puVar7[3];
              local_d8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_d8.field_2._M_allocated_capacity = *psVar10;
              local_d8._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_d8._M_string_length = puVar7[1];
            *puVar7 = psVar10;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])(ptVar9);
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_d8,*(ulong *)CONCAT44(extraout_var_00,iVar6));
            puVar11 = puVar7 + 2;
            if ((ulong *)*puVar7 == puVar11) {
              local_108 = *puVar11;
              lStack_100 = puVar7[3];
              local_118 = &local_108;
            }
            else {
              local_108 = *puVar11;
              local_118 = (ulong *)*puVar7;
            }
            local_110 = puVar7[1];
            *puVar7 = puVar11;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_118);
            if (local_118 != &local_108) {
              operator_delete(local_118);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != paVar1) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
            _Var13._M_p = local_a8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_0029ee88:
              operator_delete(_Var13._M_p);
            }
          }
          pptVar15 = pptVar15 + 1;
        } while (pptVar15 !=
                 (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_f8);
      __return_storage_ptr__ = local_80;
      if (iVar6 == 0) {
        ts_get_type_abi_cxx11_(&local_a8,local_b8,local_b0->returntype_);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x39b0db);
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_d8.field_2._M_allocated_capacity = *psVar10;
          local_d8.field_2._8_8_ = puVar7[3];
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar10;
          local_d8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_d8._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        puVar11 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar11) {
          local_108 = *puVar11;
          lStack_100 = puVar7[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *puVar11;
          local_118 = (ulong *)*puVar7;
        }
        local_110 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_118);
        if (local_118 != &local_108) {
          operator_delete(local_118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        psVar5 = &local_a8;
      }
      else {
        std::operator+(&local_78,"callback?: (error: ",&local_f8);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
        paVar1 = &local_a8.field_2;
        puVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_a8.field_2._M_allocated_capacity = *puVar11;
          local_a8.field_2._8_8_ = puVar7[3];
          local_a8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *puVar11;
          local_a8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_a8._M_string_length = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        ts_get_type_abi_cxx11_(&local_50,local_b8,local_b0->returntype_);
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          uVar14 = local_a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_50._M_string_length + local_a8._M_string_length) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            uVar14 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_50._M_string_length + local_a8._M_string_length)
          goto LAB_0029f484;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_50,0,(char *)0x0,(ulong)local_a8._M_dataplus._M_p);
        }
        else {
LAB_0029f484:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_a8,(ulong)local_50._M_dataplus._M_p);
        }
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_d8.field_2._M_allocated_capacity = *psVar10;
          local_d8.field_2._8_8_ = puVar7[3];
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar10;
          local_d8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_d8._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)psVar10 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        puVar11 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar11) {
          local_108 = *puVar11;
          lStack_100 = puVar7[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *puVar11;
          local_118 = (ulong *)*puVar7;
        }
        local_110 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_118);
        if (local_118 != &local_108) {
          operator_delete(local_118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        psVar5 = &local_78;
      }
      puVar4 = (undefined1 *)(&(psVar5->field_2)._M_allocated_capacity)[-2];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar4 != &psVar5->field_2) {
        operator_delete(puVar4);
      }
      _Var13._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_0029f251:
        operator_delete(_Var13._M_p);
      }
    }
    else {
      ts_get_type_abi_cxx11_(&local_d8,local_b8,local_b0->returntype_);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x39b11e);
      puVar11 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar11) {
        local_108 = *puVar11;
        lStack_100 = plVar8[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *puVar11;
        local_118 = (ulong *)*plVar8;
      }
      local_110 = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
      puVar11 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_f8.field_2._M_allocated_capacity = *puVar11;
        local_f8.field_2._8_8_ = puVar7[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *puVar11;
        local_f8._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_f8._M_string_length = puVar7[1];
      *puVar7 = puVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118);
      }
      _Var13._M_p = local_d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_0029f251;
    }
    if (local_b8->gen_jquery_ != true) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    ts_get_type_abi_cxx11_(&local_d8,local_b8,local_b0->returntype_);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x39b131);
    local_118 = &local_108;
    puVar11 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar11) {
      local_108 = *puVar11;
      lStack_100 = puVar7[3];
    }
    else {
      local_108 = *puVar11;
      local_118 = (ulong *)*puVar7;
    }
    local_110 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_f8._M_string_length = puVar7[1];
    *puVar7 = psVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p)
    ;
LAB_0029f349:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_0029f358;
  }
  operator_delete(local_f8._M_dataplus._M_p);
LAB_0029f358:
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_js_generator::ts_function_signature(t_function* tfunction, bool include_callback) {
  string str;
  const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;

  str = tfunction->get_name() + "(";

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    str += (*f_iter)->get_name() + ts_get_req(*f_iter) + ": " + ts_get_type((*f_iter)->get_type());

    if (f_iter + 1 != fields.end() || (include_callback && fields.size() > 0)) {
      str += ", ";
    }
  }

  if (include_callback) {
    if (gen_node_) {
      t_struct* exceptions = tfunction->get_xceptions();
      string exception_types;
      if (exceptions) {
        const vector<t_field*>& members = exceptions->get_members();
        for (vector<t_field*>::const_iterator it = members.begin(); it != members.end(); ++it) {
          t_type* t = get_true_type((*it)->get_type());
          if (it == members.begin()) {
            exception_types = js_type_namespace(t->get_program()) + t->get_name();
          } else {
            exception_types += " | " + js_type_namespace(t->get_program()) + t->get_name();
          }
        }
      }
      if (exception_types == "") {
        str += "callback?: (error: void, response: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
      } else {
        str += "callback?: (error: " + exception_types + ", response: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
      }
    } else {
      str += "callback?: (data: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
    }

    if (gen_jquery_) {
      str += "JQueryPromise<" + ts_get_type(tfunction->get_returntype()) +">;";
    } else {
      str += "void;";
    }
  } else {
    if (gen_es6_) {
      str += "): Promise<" + ts_get_type(tfunction->get_returntype()) + ">;";
    }
    else {
      str += "): " + ts_get_type(tfunction->get_returntype()) + ";";
    }
  }

  return str;
}